

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O0

QIcon __thiscall
QFusionStyle::standardIcon
          (QFusionStyle *this,StandardPixmap standardIcon,QStyleOption *option,QWidget *widget)

{
  bool bVar1;
  QStyleOption *in_RCX;
  StandardPixmap in_EDX;
  QCommonStyle *in_RSI;
  QIconPrivate *in_RDI;
  QWidget *in_R8;
  long in_FS_OFFSET;
  QIcon icon;
  undefined1 local_28 [24];
  QIcon local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  iconFromTheme((QFusionStyle *)in_RDI,(StandardPixmap)((ulong)in_RSI >> 0x20));
  QIcon::availableSizes((Mode)local_28,(State)&local_10);
  bVar1 = QList<QSize>::isEmpty((QList<QSize> *)0x4f7c2f);
  QList<QSize>::~QList((QList<QSize> *)0x4f7c3f);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    QCommonStyle::standardIcon(in_RSI,in_EDX,in_RCX,in_R8);
  }
  else {
    QIcon::QIcon((QIcon *)in_RDI,(QIcon *)&local_10);
  }
  QIcon::~QIcon(&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QIcon)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QIcon QFusionStyle::standardIcon(StandardPixmap standardIcon, const QStyleOption *option,
                                 const QWidget *widget) const
{
    const auto icon = iconFromTheme(standardIcon);
    if (!icon.availableSizes().isEmpty())
        return icon;
    return QCommonStyle::standardIcon(standardIcon, option, widget);
}